

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Vector3f __thiscall Quat4f::getAxisAngle(Quat4f *this,float *radiansOut)

{
  undefined1 auVar1 [16];
  float *in_RDX;
  Quat4f *in_RSI;
  Vector3f *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar7;
  ulong uVar8;
  double dVar6;
  undefined1 auVar9 [64];
  Vector3f VVar10;
  float reciprocalVectorNorm;
  float vectorNorm;
  float theta;
  undefined1 extraout_var [60];
  
  fVar2 = w(in_RSI);
  dVar6 = acos((double)fVar2);
  fVar2 = x(in_RSI);
  fVar3 = x(in_RSI);
  fVar4 = y(in_RSI);
  fVar5 = y(in_RSI);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar2),ZEXT416((uint)(fVar4 * fVar5)))
  ;
  fVar2 = z(in_RSI);
  auVar9._0_4_ = z(in_RSI);
  auVar9._4_60_ = extraout_var;
  auVar1 = vfmadd213ss_fma(auVar9._0_16_,ZEXT416((uint)fVar2),ZEXT416(auVar1._0_4_));
  dVar7 = sqrt((double)auVar1._0_4_);
  fVar3 = 1.0 / (float)dVar7;
  *in_RDX = (float)(dVar6 * 2.0);
  fVar4 = x(in_RSI);
  fVar2 = y(in_RSI);
  fVar2 = fVar2 * fVar3;
  fVar5 = z(in_RSI);
  uVar8 = (ulong)(uint)(fVar4 * fVar3);
  Vector3f::Vector3f(in_RDI,fVar4 * fVar3,fVar2,fVar5 * fVar3);
  VVar10.m_elements[2] = fVar2;
  VVar10.m_elements[0] = (float)(int)uVar8;
  VVar10.m_elements[1] = (float)(int)(uVar8 >> 0x20);
  return (Vector3f)VVar10.m_elements;
}

Assistant:

Vector3f Quat4f::getAxisAngle( float* radiansOut )
{
	float theta = acos( w() ) * 2;
	float vectorNorm = sqrt( x() * x() + y() * y() + z() * z() );
	float reciprocalVectorNorm = 1.f / vectorNorm;

	*radiansOut = theta;
	return Vector3f
	(
		x() * reciprocalVectorNorm,
		y() * reciprocalVectorNorm,
		z() * reciprocalVectorNorm
	);
}